

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O3

SnapRootInfoEntry * __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::NextOpenEntry
          (UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL> *this)

{
  SnapRootInfoEntry *pSVar1;
  SnapRootInfoEntry *pSVar2;
  
  pSVar2 = (this->m_inlineHeadBlock).CurrPos;
  pSVar1 = (this->m_inlineHeadBlock).EndPos;
  if ((pSVar2 <= pSVar1) &&
     ((ulong)((long)pSVar2 - (long)(this->m_inlineHeadBlock).BlockData) < 0x3018)) {
    if (pSVar2 == pSVar1) {
      AddArrayLink(this);
      pSVar2 = (this->m_inlineHeadBlock).CurrPos;
    }
    (this->m_inlineHeadBlock).CurrPos = pSVar2 + 1;
    return pSVar2;
  }
  TTDAbort_unrecoverable_error("We are off the end of the array");
}

Assistant:

T* NextOpenEntry()
        {
            TTDAssert(this->m_inlineHeadBlock.CurrPos <= this->m_inlineHeadBlock.EndPos, "We are off the end of the array");
            TTDAssert((((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T) <= allocSize, "We are off the end of the array");

            if (this->m_inlineHeadBlock.CurrPos == this->m_inlineHeadBlock.EndPos)
            {
                this->AddArrayLink();
            }

            T* entry = this->m_inlineHeadBlock.CurrPos;
            this->m_inlineHeadBlock.CurrPos++;

            return entry;
        }